

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ComputeDefines
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  char *pcVar2;
  string *psVar3;
  string defPropName;
  string COMPILE_DEFINITIONS;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string sStack_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  cmGeneratorExpressionInterpreter local_98;
  
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string
            ((string *)&local_128,
             (string *)&(this->LocalGenerator->super_cmLocalCommonGenerator).ConfigName);
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_e8,(string *)&local_128);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_108,(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_98,(cmLocalGenerator *)pcVar1,&local_e8,headTarget,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"COMPILE_DEFINITIONS",(allocator<char> *)&sStack_188);
  pcVar2 = cmSourceFile::GetProperty(source,&local_168);
  if (pcVar2 != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate(&local_98,pcVar2,&local_168);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c8,psVar3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"COMPILE_DEFINITIONS_",(allocator<char> *)&local_148);
  cmsys::SystemTools::UpperCase(&local_148,&local_128);
  std::__cxx11::string::append((string *)&sStack_188);
  std::__cxx11::string::~string((string *)&local_148);
  pcVar2 = cmSourceFile::GetProperty(source,&sStack_188);
  if (pcVar2 != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate(&local_98,pcVar2,&local_168);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c8,psVar3);
  }
  cmCommonTargetGenerator::GetDefines
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  cmLocalGenerator::JoinDefines
            ((cmLocalGenerator *)this->LocalGenerator,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c8,__return_storage_ptr__,language);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::~string((string *)&local_168);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&local_98);
  std::__cxx11::string::~string((string *)&local_128);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeDefines(cmSourceFile const* source,
                                                   const std::string& language)
{
  std::set<std::string> defines;
  const std::string config = this->LocalGenerator->GetConfigName();
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  if (const char* compile_defs = source->GetProperty(COMPILE_DEFINITIONS)) {
    this->LocalGenerator->AppendDefines(
      defines, genexInterpreter.Evaluate(compile_defs, COMPILE_DEFINITIONS));
  }

  std::string defPropName = "COMPILE_DEFINITIONS_";
  defPropName += cmSystemTools::UpperCase(config);
  if (const char* config_compile_defs = source->GetProperty(defPropName)) {
    this->LocalGenerator->AppendDefines(
      defines,
      genexInterpreter.Evaluate(config_compile_defs, COMPILE_DEFINITIONS));
  }

  std::string definesString = this->GetDefines(language);
  this->LocalGenerator->JoinDefines(defines, definesString, language);

  return definesString;
}